

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

int op_http_conn_read(OpusHTTPConn *_conn,char *_buf,int _buf_size,int _blocking)

{
  SSL *ssl;
  int iVar1;
  int iVar2;
  int *piVar3;
  ssize_t sVar4;
  int iVar5;
  int iVar6;
  pollfd local_48;
  OpusHTTPConn *local_40;
  char *local_38;
  
  local_48.fd = _conn->fd;
  ssl = (SSL *)_conn->ssl_conn;
  iVar6 = 0;
  iVar5 = 0;
  local_40 = _conn;
  local_38 = _buf;
  do {
    if (ssl == (SSL *)0x0) {
      piVar3 = __errno_location();
      *piVar3 = 0;
      sVar4 = recv(local_48.fd,local_38 + iVar5,(long)(_buf_size - iVar5),0);
      if (sVar4 < 1) {
        if ((iVar5 < 1) && (sVar4 != 0)) {
          local_48.events = 1;
          if (*piVar3 != 0xb) {
            return -0x80;
          }
          goto LAB_0010d0af;
        }
        break;
      }
      iVar5 = iVar5 + (int)sVar4;
      iVar6 = iVar6 + (int)sVar4;
    }
    else {
      iVar1 = SSL_read(ssl,local_38 + iVar5,_buf_size - iVar5);
      if (iVar1 < 1) {
        if (0 < iVar5) break;
        iVar2 = SSL_get_error(ssl,iVar1);
        if (iVar1 == 0) {
          return (uint)(iVar2 == 6) * 0x80 + -0x80;
        }
        local_48.events = 1;
        if (iVar2 != 2) {
          if (iVar2 != 3) {
            return -0x80;
          }
          local_48.events = 4;
        }
LAB_0010d0af:
        local_40->read_bytes = local_40->read_bytes + (long)iVar6;
        op_http_conn_read_rate_update(local_40);
        iVar1 = poll(&local_48,1,30000);
        iVar6 = 0;
        if (iVar1 < 1) {
          return -0x80;
        }
      }
      else {
        iVar5 = iVar5 + iVar1;
        iVar6 = iVar6 + iVar1;
      }
    }
  } while (iVar5 < _buf_size);
  local_40->read_bytes = local_40->read_bytes + (long)iVar6;
  return iVar5;
}

Assistant:

static int op_http_conn_read(OpusHTTPConn *_conn,
 char *_buf,int _buf_size,int _blocking){
  struct pollfd  fd;
  SSL           *ssl_conn;
  int            nread;
  int            nread_unblocked;
  fd.fd=_conn->fd;
  ssl_conn=_conn->ssl_conn;
  nread=nread_unblocked=0;
  /*RFC 2818 says "client implementations MUST treat any premature closes as
     errors and the data received as potentially truncated," so we make very
     sure to report read errors upwards.*/
  do{
    int err;
    if(ssl_conn!=NULL){
      int ret;
      ret=SSL_read(ssl_conn,_buf+nread,_buf_size-nread);
      OP_ASSERT(ret<=_buf_size-nread);
      if(ret>0){
        /*Read some data.
          Keep going to see if there's more.*/
        nread+=ret;
        nread_unblocked+=ret;
        continue;
      }
      /*If we already read some data, return it right now.*/
      if(nread>0)break;
      err=SSL_get_error(ssl_conn,ret);
      if(ret==0){
        /*Connection close.
          Check for a clean shutdown to prevent truncation attacks.
          This check always succeeds for SSLv2, as it has no "close notify"
           message and thus can't verify an orderly shutdown.*/
        return err==SSL_ERROR_ZERO_RETURN?0:OP_EREAD;
      }
      if(err==SSL_ERROR_WANT_READ)fd.events=POLLIN;
      /*Yes, renegotiations can cause SSL_read() to block for writing.*/
      else if(err==SSL_ERROR_WANT_WRITE)fd.events=POLLOUT;
      /*Some other error.*/
      else return OP_EREAD;
    }
    else{
      ssize_t ret;
      op_reset_errno();
      ret=recv(fd.fd,_buf+nread,_buf_size-nread,0);
      OP_ASSERT(ret<=_buf_size-nread);
      if(ret>0){
        /*Read some data.
          Keep going to see if there's more.*/
        OP_ASSERT(ret<=_buf_size-nread);
        nread+=(int)ret;
        nread_unblocked+=(int)ret;
        continue;
      }
      /*If we already read some data or the connection was closed, return
         right now.*/
      if(ret==0||nread>0)break;
      err=op_errno();
      if(err!=EAGAIN&&err!=EWOULDBLOCK)return OP_EREAD;
      fd.events=POLLIN;
    }
    _conn->read_bytes+=nread_unblocked;
    op_http_conn_read_rate_update(_conn);
    nread_unblocked=0;
    if(!_blocking)break;
    /*Need to wait to get any data at all.*/
    if(poll(&fd,1,OP_POLL_TIMEOUT_MS)<=0)return OP_EREAD;
  }
  while(nread<_buf_size);
  _conn->read_bytes+=nread_unblocked;
  return nread;
}